

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading.c
# Opt level: O0

char * threading_print_info(void)

{
  return 
  "Threading Library 0.8.8\nCopyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\nCompiled as shared library type\n"
  ;
}

Assistant:

const char *threading_print_info(void)
{
	static const char threading_info[] =
		"Threading Library " METACALL_VERSION "\n"
		"Copyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\n"

#ifdef ADT_STATIC_DEFINE
		"Compiled as static library type"
#else
		"Compiled as shared library type"
#endif

		"\n";

	return threading_info;
}